

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

void show_flag_cmds(CHAR_DATA *ch,flag_type *flag_table)

{
  long in_RSI;
  int col;
  int flag;
  char buf1 [4608];
  char buf [4608];
  int local_2420;
  int local_241c;
  char cVar1;
  undefined7 in_stack_ffffffffffffdbe9;
  char *in_stack_ffffffffffffdbf0;
  char local_1218 [4616];
  long local_10;
  
  cVar1 = '\0';
  local_2420 = 0;
  local_241c = 0;
  local_10 = in_RSI;
  while (*(long *)(local_10 + (long)local_241c * 0x18) != 0) {
    if ((*(byte *)(local_10 + (long)local_241c * 0x18 + 0x10) & 1) != 0) {
      sprintf(local_1218,"%-19.18s",*(undefined8 *)(local_10 + (long)local_241c * 0x18));
      strcat(&stack0xffffffffffffdbe8,local_1218);
      local_2420 = local_2420 + 1;
      if (local_2420 % 4 == 0) {
        strcat(&stack0xffffffffffffdbe8,"\n\r");
      }
    }
    local_241c = local_241c + 1;
  }
  if (local_2420 % 4 != 0) {
    strcat(&stack0xffffffffffffdbe8,"\n\r");
  }
  send_to_char(in_stack_ffffffffffffdbf0,(CHAR_DATA *)CONCAT71(in_stack_ffffffffffffdbe9,cVar1));
  return;
}

Assistant:

void show_flag_cmds(CHAR_DATA *ch, const struct flag_type *flag_table)
{
	char buf[MAX_STRING_LENGTH];
	char buf1[MAX_STRING_LENGTH];
	int flag;
	int col;

	buf1[0] = '\0';
	col = 0;

	for (flag = 0; flag_table[flag].name != nullptr; flag++)
	{
		if (flag_table[flag].settable)
		{
			sprintf(buf, "%-19.18s", flag_table[flag].name);
			strcat(buf1, buf);

			if (++col % 4 == 0)
				strcat(buf1, "\n\r");
		}
	}

	if (col % 4 != 0)
		strcat(buf1, "\n\r");

	send_to_char(buf1, ch);
}